

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbiscan.cpp
# Opt level: O2

RBBINode * __thiscall icu_63::RBBIRuleScanner::pushNewNode(RBBIRuleScanner *this,NodeType t)

{
  RBBINode *this_00;
  undefined4 in_register_00000034;
  
  if (*this->fRB->fStatus < U_ILLEGAL_ARGUMENT_ERROR) {
    if (this->fNodeStackPtr < 99) {
      this->fNodeStackPtr = this->fNodeStackPtr + 1;
      this_00 = (RBBINode *)UMemory::operator_new((UMemory *)0xa0,CONCAT44(in_register_00000034,t));
      if (this_00 != (RBBINode *)0x0) {
        RBBINode::RBBINode(this_00,t);
        this->fNodeStack[this->fNodeStackPtr] = this_00;
        return this_00;
      }
      this->fNodeStack[this->fNodeStackPtr] = (RBBINode *)0x0;
      *this->fRB->fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      error(this,U_BRK_RULE_SYNTAX);
    }
  }
  return (RBBINode *)0x0;
}

Assistant:

RBBINode  *RBBIRuleScanner::pushNewNode(RBBINode::NodeType  t) {
    if (U_FAILURE(*fRB->fStatus)) {
        return NULL;
    }
    if (fNodeStackPtr >= kStackSize - 1) {
        error(U_BRK_RULE_SYNTAX);
        RBBIDebugPuts("RBBIRuleScanner::pushNewNode - stack overflow.");
        return NULL;
    }
    fNodeStackPtr++;
    fNodeStack[fNodeStackPtr] = new RBBINode(t);
    if (fNodeStack[fNodeStackPtr] == NULL) {
        *fRB->fStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    return fNodeStack[fNodeStackPtr];
}